

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>>
               (tuple<testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                *matcher_tuple,
               tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *value_tuple)

{
  bool bVar1;
  MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *this;
  span<unsigned_char,__1L> *x;
  undefined1 local_19;
  tuple<int,_const_pstore::gsl::span<unsigned_char,__1L>_&> *value_tuple_local;
  tuple<testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>,std::tuple<int,pstore::gsl::span<unsigned_char,_1l>const&>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<1ul,testing::Matcher<int>,testing::Matcher<pstore::gsl::span<unsigned_char,_1l>const&>>
                      (matcher_tuple)->
            super_MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&>;
    x = std::get<1ul,int,pstore::gsl::span<unsigned_char,_1l>const&>(value_tuple);
    local_19 = MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }